

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::pointer_writer<unsigned_long>&>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          pointer_writer<unsigned_long> *f)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  fill_t<char> *fill;
  unsigned_long uVar8;
  ulong uVar9;
  size_t n;
  bool bVar10;
  
  uVar5 = f->num_digits + 2;
  uVar9 = (ulong)uVar5;
  if ((uint)specs->width <= uVar5) {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar9 = lVar2 + uVar9;
    if ((ulong)puVar1[3] < uVar9) {
      (**(code **)*puVar1)(puVar1,uVar9);
    }
    puVar1[2] = uVar9;
    lVar3 = puVar1[1];
    *(undefined2 *)(lVar3 + lVar2) = 0x7830;
    pcVar6 = (char *)(lVar3 + f->num_digits + lVar2 + 1);
    uVar8 = f->value;
    do {
      *pcVar6 = "0123456789abcdef"[(uint)uVar8 & 0xf];
      pcVar6 = pcVar6 + -1;
      bVar10 = 0xf < uVar8;
      uVar8 = uVar8 >> 4;
    } while (bVar10);
    return;
  }
  n = (uint)specs->width - uVar9;
  puVar1 = *(undefined8 **)this;
  lVar2 = puVar1[2];
  uVar9 = (specs->fill).size_ * n + uVar9 + lVar2;
  if ((ulong)puVar1[3] < uVar9) {
    (**(code **)*puVar1)(puVar1,uVar9);
  }
  puVar1[2] = uVar9;
  lVar3 = puVar1[1];
  pcVar6 = (char *)(lVar3 + lVar2);
  fill = &specs->fill;
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    pcVar7 = fill<char*,char>(pcVar6,n >> 1,fill);
    pcVar7[0] = '0';
    pcVar7[1] = 'x';
    pcVar6 = pcVar7 + f->num_digits;
    pcVar7 = pcVar7 + (long)f->num_digits + 1;
    uVar8 = f->value;
    do {
      *pcVar7 = "0123456789abcdef"[(uint)uVar8 & 0xf];
      pcVar7 = pcVar7 + -1;
      bVar10 = 0xf < uVar8;
      uVar8 = uVar8 >> 4;
    } while (bVar10);
    n = n - (n >> 1);
  }
  else {
    if (bVar4 == 2) {
      pcVar6 = fill<char*,char>(pcVar6,n,fill);
      pcVar6[0] = '0';
      pcVar6[1] = 'x';
      pcVar6 = pcVar6 + (long)f->num_digits + 1;
      uVar8 = f->value;
      do {
        *pcVar6 = "0123456789abcdef"[(uint)uVar8 & 0xf];
        pcVar6 = pcVar6 + -1;
        bVar10 = 0xf < uVar8;
        uVar8 = uVar8 >> 4;
      } while (bVar10);
      return;
    }
    *(undefined2 *)(lVar3 + lVar2) = 0x7830;
    pcVar6 = pcVar6 + f->num_digits;
    pcVar7 = (char *)(lVar3 + lVar2 + f->num_digits + 1);
    uVar8 = f->value;
    do {
      *pcVar7 = "0123456789abcdef"[(uint)uVar8 & 0xf];
      pcVar7 = pcVar7 + -1;
      bVar10 = 0xf < uVar8;
      uVar8 = uVar8 >> 4;
    } while (bVar10);
  }
  fill<char*,char>(pcVar6 + 2,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }